

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O3

void __thiscall
QOpenGL2PaintEngineExPrivate::drawPixmapFragments
          (QOpenGL2PaintEngineExPrivate *this,PixmapFragment *fragments,int fragmentCount,
          QPixmap *pixmap,PixmapFragmentHints hints)

{
  QOpenGL2PEXVertexArray *this_00;
  QOpenGL2PEXVertexArray *this_01;
  QDataBuffer<float> *this_02;
  qsizetype *pqVar1;
  double *pdVar2;
  QOpenGLPoint *pQVar3;
  long lVar4;
  float *data;
  qsizetype qVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  GLuint GVar11;
  int extraout_var;
  QOpenGLShaderProgram *pQVar12;
  socklen_t sVar13;
  QPixmap *pQVar14;
  long lVar15;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  PixelSrcType type;
  long lVar16;
  long in_FS_OFFSET;
  float fVar17;
  double dVar18;
  double dVar19;
  float fVar27;
  QOpenGLPoint QVar20;
  QOpenGLPoint QVar21;
  QOpenGLPoint QVar22;
  QOpenGLPoint QVar23;
  QOpenGLPoint QVar24;
  QOpenGLPoint QVar25;
  QOpenGLPoint QVar26;
  double dVar28;
  double dVar29;
  QOpenGLPoint QVar30;
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  byte local_e9;
  byte local_bc;
  QColor local_58;
  QColor local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar14 = pixmap;
  iVar9 = QPixmap::size();
  QPixmap::size();
  this_00 = &this->vertexCoordinateArray;
  QOpenGL2PEXVertexArray::clear(this_00);
  this_01 = &this->textureCoordinateArray;
  QOpenGL2PEXVertexArray::clear(this_01);
  (this->opacityArray).siz = 0;
  if (this->snapToPixelGrid == true) {
    this->snapToPixelGrid = false;
    this->matrixDirty = true;
  }
  if (fragmentCount < 1) {
    local_e9 = 1;
  }
  else {
    auVar31._0_4_ = (float)iVar9;
    auVar31._4_4_ = (float)extraout_var;
    auVar31._8_8_ = 0;
    auVar31 = divps(_DAT_0017ec10,auVar31);
    this_02 = &this->opacityArray;
    local_e9 = 1;
    lVar16 = 0;
    do {
      dVar29 = *(double *)((long)&fragments->rotation + lVar16);
      dVar19 = 1.0;
      dVar18 = 0.0;
      if ((dVar29 != 0.0) || (NAN(dVar29))) {
        dVar18 = dVar29 * 0.017453292519943295 * 40.74366543152521;
        uVar10 = (uint)dVar18;
        dVar28 = (double)(int)dVar18 * -0.02454369260617026 + dVar29 * 0.017453292519943295;
        dVar18 = *(double *)(&qt_sine_table + (ulong)(uVar10 & 0xff) * 8);
        dVar29 = *(double *)(&qt_sine_table + (ulong)(uVar10 + 0x40 & 0xff) * 8);
        dVar19 = dVar29 + dVar28 * -(dVar29 * 0.5 * dVar28 + dVar18);
        dVar18 = dVar18 + dVar28 * (dVar18 * -0.5 * dVar28 + dVar29);
      }
      dVar33 = *(double *)((long)&fragments->scaleX + lVar16) * 0.5 *
               *(double *)((long)&fragments->width + lVar16);
      dVar29 = *(double *)((long)&fragments->scaleY + lVar16) * 0.5 *
               *(double *)((long)&fragments->height + lVar16);
      dVar28 = dVar18 * -dVar29;
      dVar29 = dVar19 * dVar29;
      dVar19 = dVar33 * dVar19;
      dVar33 = dVar33 * dVar18;
      fVar17 = (float)(dVar19 + dVar28);
      fVar27 = (float)(dVar33 + dVar29);
      dVar18 = (double)fVar17;
      dVar32 = (double)fVar27;
      pdVar2 = (double *)((long)&fragments->x + lVar16);
      QVar20.x = (float)(*pdVar2 + dVar18);
      QVar20.y = (float)(pdVar2[1] + dVar32);
      QDataBuffer<QOpenGLPoint>::reserve
                (&this_00->vertexArray,(this->vertexCoordinateArray).vertexArray.siz + 1);
      (this->vertexCoordinateArray).vertexArray.buffer
      [(this->vertexCoordinateArray).vertexArray.siz] = QVar20;
      lVar15 = (this->vertexCoordinateArray).vertexArray.siz;
      (this->vertexCoordinateArray).vertexArray.siz = lVar15 + 1;
      dVar19 = (double)(float)(dVar28 - dVar19);
      dVar28 = (double)(float)(dVar29 - dVar33);
      pdVar2 = (double *)((long)&fragments->x + lVar16);
      QVar21.x = (float)(*pdVar2 - dVar19);
      QVar21.y = (float)(pdVar2[1] - dVar28);
      QDataBuffer<QOpenGLPoint>::reserve(&this_00->vertexArray,lVar15 + 2);
      (this->vertexCoordinateArray).vertexArray.buffer
      [(this->vertexCoordinateArray).vertexArray.siz] = QVar21;
      lVar15 = (this->vertexCoordinateArray).vertexArray.siz;
      (this->vertexCoordinateArray).vertexArray.siz = lVar15 + 1;
      dVar29 = (double)-fVar17;
      dVar33 = (double)-fVar27;
      pdVar2 = (double *)((long)&fragments->x + lVar16);
      QVar22.x = (float)(*pdVar2 + dVar29);
      QVar22.y = (float)(pdVar2[1] + dVar33);
      QDataBuffer<QOpenGLPoint>::reserve(&this_00->vertexArray,lVar15 + 2);
      (this->vertexCoordinateArray).vertexArray.buffer
      [(this->vertexCoordinateArray).vertexArray.siz] = QVar22;
      lVar15 = (this->vertexCoordinateArray).vertexArray.siz;
      (this->vertexCoordinateArray).vertexArray.siz = lVar15 + 1;
      pdVar2 = (double *)((long)&fragments->x + lVar16);
      QVar23.x = (float)(*pdVar2 + dVar29);
      QVar23.y = (float)(pdVar2[1] + dVar33);
      QDataBuffer<QOpenGLPoint>::reserve(&this_00->vertexArray,lVar15 + 2);
      (this->vertexCoordinateArray).vertexArray.buffer
      [(this->vertexCoordinateArray).vertexArray.siz] = QVar23;
      lVar15 = (this->vertexCoordinateArray).vertexArray.siz;
      (this->vertexCoordinateArray).vertexArray.siz = lVar15 + 1;
      pdVar2 = (double *)((long)&fragments->x + lVar16);
      QVar24.x = (float)(*pdVar2 + dVar19);
      QVar24.y = (float)(pdVar2[1] + dVar28);
      QDataBuffer<QOpenGLPoint>::reserve(&this_00->vertexArray,lVar15 + 2);
      (this->vertexCoordinateArray).vertexArray.buffer
      [(this->vertexCoordinateArray).vertexArray.siz] = QVar24;
      lVar15 = (this->vertexCoordinateArray).vertexArray.siz;
      (this->vertexCoordinateArray).vertexArray.siz = lVar15 + 1;
      pdVar2 = (double *)((long)&fragments->x + lVar16);
      QVar25.x = (float)(*pdVar2 + dVar18);
      QVar25.y = (float)(pdVar2[1] + dVar32);
      QDataBuffer<QOpenGLPoint>::reserve(&this_00->vertexArray,lVar15 + 2);
      (this->vertexCoordinateArray).vertexArray.buffer
      [(this->vertexCoordinateArray).vertexArray.siz] = QVar25;
      pqVar1 = &(this->vertexCoordinateArray).vertexArray.siz;
      *pqVar1 = *pqVar1 + 1;
      pdVar2 = (double *)((long)&fragments->sourceLeft + lVar16);
      dVar29 = *pdVar2;
      dVar18 = pdVar2[1];
      pdVar2 = (double *)((long)&fragments->width + lVar16);
      QVar26.x = (float)((*pdVar2 + dVar29) * (double)auVar31._0_4_);
      QVar26.y = (float)((pdVar2[1] + dVar18) * (double)auVar31._4_4_);
      QDataBuffer<QOpenGLPoint>::reserve
                (&this_01->vertexArray,(this->textureCoordinateArray).vertexArray.siz + 1);
      (this->textureCoordinateArray).vertexArray.buffer
      [(this->textureCoordinateArray).vertexArray.siz] = QVar26;
      lVar15 = (this->textureCoordinateArray).vertexArray.siz;
      (this->textureCoordinateArray).vertexArray.siz = lVar15 + 1;
      QDataBuffer<QOpenGLPoint>::reserve(&this_01->vertexArray,lVar15 + 2);
      lVar15 = (this->textureCoordinateArray).vertexArray.siz;
      pQVar3 = (this->textureCoordinateArray).vertexArray.buffer;
      QVar30.x = (float)(dVar29 * (double)auVar31._0_4_);
      QVar30.y = (float)(dVar18 * (double)auVar31._4_4_);
      pQVar3[lVar15].x = QVar26.x;
      pQVar3[lVar15].y = QVar30.y;
      lVar15 = (this->textureCoordinateArray).vertexArray.siz;
      (this->textureCoordinateArray).vertexArray.siz = lVar15 + 1;
      QDataBuffer<QOpenGLPoint>::reserve(&this_01->vertexArray,lVar15 + 2);
      (this->textureCoordinateArray).vertexArray.buffer
      [(this->textureCoordinateArray).vertexArray.siz] = QVar30;
      lVar15 = (this->textureCoordinateArray).vertexArray.siz;
      (this->textureCoordinateArray).vertexArray.siz = lVar15 + 1;
      QDataBuffer<QOpenGLPoint>::reserve(&this_01->vertexArray,lVar15 + 2);
      (this->textureCoordinateArray).vertexArray.buffer
      [(this->textureCoordinateArray).vertexArray.siz] = QVar30;
      lVar15 = (this->textureCoordinateArray).vertexArray.siz;
      (this->textureCoordinateArray).vertexArray.siz = lVar15 + 1;
      QDataBuffer<QOpenGLPoint>::reserve(&this_01->vertexArray,lVar15 + 2);
      lVar15 = (this->textureCoordinateArray).vertexArray.siz;
      pQVar3 = (this->textureCoordinateArray).vertexArray.buffer;
      pQVar3[lVar15].x = QVar30.x;
      pQVar3[lVar15].y = QVar26.y;
      lVar15 = (this->textureCoordinateArray).vertexArray.siz;
      (this->textureCoordinateArray).vertexArray.siz = lVar15 + 1;
      QDataBuffer<QOpenGLPoint>::reserve(&this_01->vertexArray,lVar15 + 2);
      (this->textureCoordinateArray).vertexArray.buffer
      [(this->textureCoordinateArray).vertexArray.siz] = QVar26;
      pqVar1 = &(this->textureCoordinateArray).vertexArray.siz;
      *pqVar1 = *pqVar1 + 1;
      lVar4 = *(long *)&this->q->field_0x8;
      lVar15 = lVar4 + -8;
      if (lVar4 == 0) {
        lVar15 = 0;
      }
      dVar29 = *(double *)((long)&fragments->opacity + lVar16) * *(double *)(lVar15 + 0x198);
      fVar17 = (float)dVar29;
      QDataBuffer<float>::reserve(this_02,(this->opacityArray).siz + 1);
      lVar15 = (this->opacityArray).siz;
      (this->opacityArray).buffer[lVar15] = fVar17;
      (this->opacityArray).siz = lVar15 + 1;
      QDataBuffer<float>::reserve(this_02,lVar15 + 2);
      lVar15 = (this->opacityArray).siz;
      (this->opacityArray).buffer[lVar15] = fVar17;
      (this->opacityArray).siz = lVar15 + 1;
      QDataBuffer<float>::reserve(this_02,lVar15 + 2);
      lVar15 = (this->opacityArray).siz;
      (this->opacityArray).buffer[lVar15] = fVar17;
      (this->opacityArray).siz = lVar15 + 1;
      QDataBuffer<float>::reserve(this_02,lVar15 + 2);
      lVar15 = (this->opacityArray).siz;
      (this->opacityArray).buffer[lVar15] = fVar17;
      (this->opacityArray).siz = lVar15 + 1;
      QDataBuffer<float>::reserve(this_02,lVar15 + 2);
      lVar15 = (this->opacityArray).siz;
      (this->opacityArray).buffer[lVar15] = fVar17;
      (this->opacityArray).siz = lVar15 + 1;
      QDataBuffer<float>::reserve(this_02,lVar15 + 2);
      lVar15 = (this->opacityArray).siz;
      pQVar14 = (QPixmap *)(this->opacityArray).buffer;
      *(float *)(pQVar14 + lVar15 * 4) = fVar17;
      (this->opacityArray).siz = lVar15 + 1;
      local_e9 = local_e9 & 0.9900000095367432 <= dVar29;
      lVar16 = lVar16 + 0x50;
    } while ((ulong)(uint)fragmentCount * 0x50 != lVar16);
  }
  sVar13 = (socklen_t)pQVar14;
  iVar9 = 4;
  transferMode(this,ImageOpacityArrayDrawingMode);
  pQVar3 = (this->vertexCoordinateArray).vertexArray.buffer;
  qVar5 = (this->vertexCoordinateArray).vertexArray.siz;
  QOpenGLBuffer::bind(&this->vertexBuffer,iVar9,__addr,sVar13);
  QOpenGLBuffer::allocate(&this->vertexBuffer,pQVar3,(int)qVar5 << 3);
  bVar8 = false;
  iVar9 = 2;
  sVar13 = 0;
  (**(code **)(*(long *)&this->funcs + 0x468))(0,2,0x1406,0,0);
  pQVar3 = (this->textureCoordinateArray).vertexArray.buffer;
  qVar5 = (this->textureCoordinateArray).vertexArray.siz;
  QOpenGLBuffer::bind(&this->texCoordBuffer,iVar9,__addr_00,sVar13);
  QOpenGLBuffer::allocate(&this->texCoordBuffer,pQVar3,(int)qVar5 << 3);
  iVar9 = 2;
  sVar13 = 0;
  (**(code **)(*(long *)&this->funcs + 0x468))(1,2,0x1406,0,0);
  data = (this->opacityArray).buffer;
  qVar5 = (this->opacityArray).siz;
  QOpenGLBuffer::bind(&this->opacityBuffer,iVar9,__addr_01,sVar13);
  QOpenGLBuffer::allocate(&this->opacityBuffer,data,(int)qVar5 << 2);
  (**(code **)(*(long *)&this->funcs + 0x468))(2,1,0x1406,0,0);
  lVar15 = *(long *)&this->q->field_0x8;
  lVar16 = lVar15 + -8;
  if (lVar15 == 0) {
    lVar16 = 0;
  }
  updateTexture<QPixmap>
            (this,0,pixmap,0x812f,0x2601 - ((*(uint *)(lVar16 + 0x6c) & 4) == 0),UpdateIfNeeded);
  cVar6 = QPixmap::isQBitmap();
  if (cVar6 == '\0') {
    bVar7 = QPixmap::hasAlpha();
    local_bc = (byte)hints.super_QFlagsStorageHelper<QPainter::PixmapFragmentHint,_4>.
                     super_QFlagsStorage<QPainter::PixmapFragmentHint>.i;
    bVar8 = (bool)((bVar7 ^ 1 | local_bc) & local_e9);
    type = ImageSrc;
  }
  else {
    type = PatternSrc;
  }
  QBrush::operator=(&this->currentBrush,&this->noBrush);
  QOpenGLEngineShaderManager::setSrcPixelType
            ((QOpenGLEngineShaderManager *)this->shaderManager,type);
  bVar8 = prepareForDraw(this,bVar8);
  if (bVar8) {
    pQVar12 = QOpenGLEngineShaderManager::currentProgram
                        ((QOpenGLEngineShaderManager *)this->shaderManager);
    GVar11 = QOpenGLEngineShaderManager::getUniformLocation
                       ((QOpenGLEngineShaderManager *)this->shaderManager,ImageTexture);
    QOpenGLShaderProgram::setUniformValue(pQVar12,GVar11,0);
  }
  if (cVar6 != '\0') {
    local_58._12_4_ = 0xaaaaaaaa;
    auVar31 = QPen::color();
    local_48._0_8_ = auVar31._0_8_;
    lVar15 = *(long *)&this->q->field_0x8;
    lVar16 = lVar15 + -8;
    if (lVar15 == 0) {
      lVar16 = 0;
    }
    dVar29 = *(double *)(lVar16 + 0x198);
    local_48._8_8_ = auVar31._8_8_ & 0xffffffffffff;
    fVar17 = (float)QColor::alphaF();
    fVar17 = fVar17 * (float)dVar29;
    QColor::setAlphaF(fVar17);
    fVar27 = (float)QColor::redF();
    QColor::setRedF(fVar27 * fVar17);
    fVar27 = (float)QColor::greenF();
    QColor::setGreenF(fVar27 * fVar17);
    fVar27 = (float)QColor::blueF();
    QColor::setBlueF(fVar27 * fVar17);
    local_58._0_8_ = local_48._0_8_;
    local_58.ct._4_4_ = local_48.ct._4_4_;
    local_58.ct.argb.pad = local_48.ct._8_2_;
    pQVar12 = QOpenGLEngineShaderManager::currentProgram
                        ((QOpenGLEngineShaderManager *)this->shaderManager);
    GVar11 = QOpenGLEngineShaderManager::getUniformLocation
                       ((QOpenGLEngineShaderManager *)this->shaderManager,PatternColor);
    QOpenGLShaderProgram::setUniformValue(pQVar12,GVar11,&local_58);
  }
  (**(code **)(*(long *)&this->funcs + 0x78))(4,0,fragmentCount * 6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGL2PaintEngineExPrivate::drawPixmapFragments(const QPainter::PixmapFragment *fragments,
                                                   int fragmentCount, const QPixmap &pixmap,
                                                   QPainter::PixmapFragmentHints hints)
{
    GLfloat dx = 1.0f / pixmap.size().width();
    GLfloat dy = 1.0f / pixmap.size().height();

    vertexCoordinateArray.clear();
    textureCoordinateArray.clear();
    opacityArray.reset();

    if (snapToPixelGrid) {
        snapToPixelGrid = false;
        matrixDirty = true;
    }

    bool allOpaque = true;

    for (int i = 0; i < fragmentCount; ++i) {
        qreal s = 0;
        qreal c = 1;
        if (fragments[i].rotation != 0) {
            s = qFastSin(qDegreesToRadians(fragments[i].rotation));
            c = qFastCos(qDegreesToRadians(fragments[i].rotation));
        }

        qreal right = 0.5 * fragments[i].scaleX * fragments[i].width;
        qreal bottom = 0.5 * fragments[i].scaleY * fragments[i].height;
        QOpenGLPoint bottomRight(right * c - bottom * s, right * s + bottom * c);
        QOpenGLPoint bottomLeft(-right * c - bottom * s, -right * s + bottom * c);

        vertexCoordinateArray.addVertex(bottomRight.x + fragments[i].x, bottomRight.y + fragments[i].y);
        vertexCoordinateArray.addVertex(-bottomLeft.x + fragments[i].x, -bottomLeft.y + fragments[i].y);
        vertexCoordinateArray.addVertex(-bottomRight.x + fragments[i].x, -bottomRight.y + fragments[i].y);
        vertexCoordinateArray.addVertex(-bottomRight.x + fragments[i].x, -bottomRight.y + fragments[i].y);
        vertexCoordinateArray.addVertex(bottomLeft.x + fragments[i].x, bottomLeft.y + fragments[i].y);
        vertexCoordinateArray.addVertex(bottomRight.x + fragments[i].x, bottomRight.y + fragments[i].y);

        QOpenGLRect src(fragments[i].sourceLeft * dx, fragments[i].sourceTop * dy,
                    (fragments[i].sourceLeft + fragments[i].width) * dx,
                    (fragments[i].sourceTop + fragments[i].height) * dy);

        textureCoordinateArray.addVertex(src.right, src.bottom);
        textureCoordinateArray.addVertex(src.right, src.top);
        textureCoordinateArray.addVertex(src.left, src.top);
        textureCoordinateArray.addVertex(src.left, src.top);
        textureCoordinateArray.addVertex(src.left, src.bottom);
        textureCoordinateArray.addVertex(src.right, src.bottom);

        qreal opacity = fragments[i].opacity * q->state()->opacity;
        opacityArray << opacity << opacity << opacity << opacity << opacity << opacity;
        allOpaque &= (opacity >= 0.99f);
    }

    transferMode(ImageOpacityArrayDrawingMode);

    uploadData(QT_VERTEX_COORDS_ATTR, (GLfloat*)vertexCoordinateArray.data(), vertexCoordinateArray.vertexCount() * 2);
    uploadData(QT_TEXTURE_COORDS_ATTR, (GLfloat*)textureCoordinateArray.data(), textureCoordinateArray.vertexCount() * 2);
    uploadData(QT_OPACITY_ATTR, (GLfloat*)opacityArray.data(), opacityArray.size());

    GLenum filterMode = q->state()->renderHints & QPainter::SmoothPixmapTransform ? GL_LINEAR : GL_NEAREST;
    updateTexture(QT_IMAGE_TEXTURE_UNIT, pixmap, GL_CLAMP_TO_EDGE, filterMode);

    bool isBitmap = pixmap.isQBitmap();
    bool isOpaque = !isBitmap && (!pixmap.hasAlpha() || (hints & QPainter::OpaqueHint)) && allOpaque;

    // Setup for texture drawing
    currentBrush = noBrush;
    shaderManager->setSrcPixelType(isBitmap ? QOpenGLEngineShaderManager::PatternSrc
                                            : QOpenGLEngineShaderManager::ImageSrc);
    if (prepareForDraw(isOpaque))
        shaderManager->currentProgram()->setUniformValue(location(QOpenGLEngineShaderManager::ImageTexture), QT_IMAGE_TEXTURE_UNIT);

    if (isBitmap) {
        QColor col = qt_premultiplyColor(q->state()->pen.color(), (GLfloat)q->state()->opacity);
        shaderManager->currentProgram()->setUniformValue(location(QOpenGLEngineShaderManager::PatternColor), col);
    }

    funcs.glDrawArrays(GL_TRIANGLES, 0, 6 * fragmentCount);
}